

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int push_change_cipher_spec(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  undefined1 local_24;
  undefined1 local_23 [3];
  
  iVar1 = 0;
  if ((tls->field_0x160 & 4) != 0) {
    if (emitter->begin_message == begin_record_message) {
      iVar1 = ptls_buffer__do_pushv(emitter->buf,local_23,3);
      if ((iVar1 == 0) && (iVar1 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar1 == 0)) {
        sVar4 = emitter->buf->off;
        iVar1 = ptls_buffer__do_pushv(emitter->buf,&local_24,1);
        if (iVar1 == 0) {
          uVar2 = emitter->buf->off - sVar4;
          for (lVar3 = 8; lVar3 != -8; lVar3 = lVar3 + -8) {
            emitter->buf->base[sVar4 - 2] = (uint8_t)(uVar2 >> ((byte)lVar3 & 0x3f));
            sVar4 = sVar4 + 1;
          }
          tls->field_0x160 = tls->field_0x160 & 0xfb;
          iVar1 = 0;
        }
      }
    }
    else {
      iVar1 = 10;
    }
  }
  return iVar1;
}

Assistant:

static int push_change_cipher_spec(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    int ret;

    /* check if we are requested to (or still need to) */
    if (!tls->send_change_cipher_spec) {
        ret = 0;
        goto Exit;
    }

    /* CCS is a record, can only be sent when using a record-based protocol. */
    if (emitter->begin_message != begin_record_message) {
        ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        goto Exit;
    }

    /* emit CCS */
    buffer_push_record(emitter->buf, PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC, { ptls_buffer_push(emitter->buf, 1); });

    tls->send_change_cipher_spec = 0;
    ret = 0;
Exit:
    return ret;
}